

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O0

void __thiscall spvtools::opt::InstructionList::clear(InstructionList *this)

{
  bool bVar1;
  Instruction *this_00;
  Instruction *inst;
  InstructionList *this_local;
  
  while (bVar1 = utils::IntrusiveList<spvtools::opt::Instruction>::empty
                           (&this->super_IntrusiveList<spvtools::opt::Instruction>),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::front
                        (&this->super_IntrusiveList<spvtools::opt::Instruction>);
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
              (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    if (this_00 != (Instruction *)0x0) {
      (*(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])()
      ;
    }
  }
  return;
}

Assistant:

void InstructionList::clear() {
  while (!empty()) {
    Instruction* inst = &front();
    inst->RemoveFromList();
    delete inst;
  }
}